

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_divo(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  TCGv_i64 retval;
  TCGv_ptr arg1;
  TCGv_i64 arg2;
  uint32_t uVar1;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  uVar1 = rD(ctx->opcode);
  retval = cpu_gpr[uVar1];
  arg1 = tcg_ctx_00->cpu_env;
  uVar1 = rA(ctx->opcode);
  arg2 = cpu_gpr[uVar1];
  uVar1 = rB(ctx->opcode);
  gen_helper_divo(tcg_ctx_00,retval,arg1,arg2,cpu_gpr[uVar1]);
  uVar1 = Rc(ctx->opcode);
  if (uVar1 != 0) {
    uVar1 = rD(ctx->opcode);
    gen_set_Rc0(ctx,cpu_gpr[uVar1]);
  }
  return;
}

Assistant:

static void gen_divo(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    gen_helper_divo(tcg_ctx, cpu_gpr[rD(ctx->opcode)], tcg_ctx->cpu_env, cpu_gpr[rA(ctx->opcode)],
                    cpu_gpr[rB(ctx->opcode)]);
    if (unlikely(Rc(ctx->opcode) != 0)) {
        gen_set_Rc0(ctx, cpu_gpr[rD(ctx->opcode)]);
    }
}